

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oarchive_std_suite.cpp
# Opt level: O0

void vector_suite::test_bool_two(void)

{
  iterator iVar1;
  iterator iVar2;
  undefined4 local_f8;
  undefined1 local_f4;
  undefined1 local_f3 [3];
  output_type expected [5];
  vector<bool,_std::allocator<bool>_> value;
  undefined1 local_b8 [8];
  oarchive ar;
  undefined1 local_20 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  trial::protocol::bintoken::oarchive::
  oarchive<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((oarchive *)local_b8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20)
  ;
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)expected);
  std::vector<bool,_std::allocator<bool>_>::push_back
            ((vector<bool,_std::allocator<bool>_> *)expected,true);
  std::vector<bool,_std::allocator<bool>_>::push_back
            ((vector<bool,_std::allocator<bool>_> *)expected,false);
  boost::archive::detail::interface_oarchive<trial::protocol::bintoken::oarchive>::operator<<
            ((interface_oarchive<trial::protocol::bintoken::oarchive> *)local_b8,
             (vector<bool,_std::allocator<bool>_> *)expected);
  local_f4 = 0x93;
  local_f8 = 0x80810292;
  iVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  iVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  boost::detail::
  test_all_with_impl<std::ostream,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/oarchive_std_suite.cpp"
             ,0x162,"void vector_suite::test_bool_two()",iVar1._M_current,iVar2._M_current,&local_f8
             ,local_f3);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)expected)
  ;
  trial::protocol::bintoken::oarchive::~oarchive((oarchive *)local_b8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_20);
  return;
}

Assistant:

void test_bool_two()
{
    std::vector<output_type> result;
    format::oarchive ar(result);
    std::vector<bool> value;
    value.push_back(true);
    value.push_back(false);
    ar << value;

    output_type expected[] = { token::code::begin_array,
                              0x02,
                              token::code::true_value,
                              token::code::false_value,
                              token::code::end_array };
    TRIAL_PROTOCOL_TEST_ALL_WITH(result.begin(), result.end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<output_type>());
}